

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event.cpp
# Opt level: O0

void __thiscall sc_core::sc_event_list::push_back(sc_event_list *this,sc_event_list *el)

{
  size_type sVar1;
  sc_event_list *in_RSI;
  sc_event *in_RDI;
  sc_event_list *unaff_retaddr;
  size_type in_stack_00000008;
  vector<const_sc_core::sc_event_*,_std::allocator<const_sc_core::sc_event_*>_> *in_stack_00000010;
  int i;
  undefined4 local_14;
  
  size((sc_event_list *)0x2a2dbd);
  size((sc_event_list *)0x2a2dcb);
  std::vector<const_sc_core::sc_event_*,_std::allocator<const_sc_core::sc_event_*>_>::reserve
            (in_stack_00000010,in_stack_00000008);
  sVar1 = std::vector<const_sc_core::sc_event_*,_std::allocator<const_sc_core::sc_event_*>_>::size
                    ((vector<const_sc_core::sc_event_*,_std::allocator<const_sc_core::sc_event_*>_>
                      *)in_RSI);
  local_14 = (int)sVar1;
  while (local_14 = local_14 + -1, -1 < local_14) {
    std::vector<const_sc_core::sc_event_*,_std::allocator<const_sc_core::sc_event_*>_>::operator[]
              ((vector<const_sc_core::sc_event_*,_std::allocator<const_sc_core::sc_event_*>_> *)
               in_RSI,(long)local_14);
    push_back(unaff_retaddr,in_RDI);
  }
  auto_delete(in_RSI);
  return;
}

Assistant:

void
sc_event_list::push_back( const sc_event_list& el )
{
    m_events.reserve( size() + el.size() );
    for ( int i = el.m_events.size() - 1; i >= 0; --i )
    {
        push_back( *el.m_events[i] );
    }
    el.auto_delete();
}